

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t ulocimp_getRegionForSupplementalData_63
                  (char *localeID,UBool inferRegion,char *region,int32_t regionCapacity,
                  UErrorCode *status)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  char *rgPtr;
  char *pcVar4;
  char rgBuf [8];
  UErrorCode rgStatus;
  char locBuf [157];
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  pcVar4 = rgBuf;
  rgStatus = U_ZERO_ERROR;
  iVar2 = uloc_getKeywordValue_63(localeID,"rg",rgBuf,8,&rgStatus);
  if ((rgStatus < U_ILLEGAL_ARGUMENT_ERROR) && (iVar2 == 6)) {
    for (; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
      cVar1 = uprv_toupper_63(*pcVar4);
      *pcVar4 = cVar1;
    }
    iVar3 = bcmp(rgBuf + 2,"ZZZZ",5);
    if (iVar3 == 0) {
      iVar3 = 2;
      goto LAB_00280d71;
    }
  }
  iVar2 = uloc_getCountry_63(localeID,rgBuf,8,status);
  iVar3 = 0;
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (iVar3 = iVar2, inferRegion != '\0' && iVar2 == 0)) {
    rgStatus = U_ZERO_ERROR;
    uloc_addLikelySubtags_63(localeID,locBuf,0x9d,&rgStatus);
    iVar3 = 0;
    if (rgStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = uloc_getCountry_63(locBuf,rgBuf,8,status);
      iVar3 = 0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar3 = iVar2;
      }
    }
  }
LAB_00280d71:
  rgBuf[iVar3] = '\0';
  strncpy(region,rgBuf,(long)regionCapacity);
  iVar2 = u_terminateChars_63(region,regionCapacity,iVar3,status);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_getRegionForSupplementalData(const char *localeID, UBool inferRegion,
                                     char *region, int32_t regionCapacity, UErrorCode* status) {
    if (U_FAILURE(*status)) {
        return 0;
    }
    char rgBuf[ULOC_RG_BUFLEN];
    UErrorCode rgStatus = U_ZERO_ERROR;

    // First check for rg keyword value
    int32_t rgLen = uloc_getKeywordValue(localeID, "rg", rgBuf, ULOC_RG_BUFLEN, &rgStatus);
    if (U_FAILURE(rgStatus) || rgLen != 6) {
        rgLen = 0;
    } else {
        // rgBuf guaranteed to be zero terminated here, with text len 6
        char *rgPtr = rgBuf;
        for (; *rgPtr!= 0; rgPtr++) {
            *rgPtr = uprv_toupper(*rgPtr);
        }
        rgLen = (uprv_strcmp(rgBuf+2, "ZZZZ") == 0)? 2: 0;
    }

    if (rgLen == 0) {
        // No valid rg keyword value, try for unicode_region_subtag
        rgLen = uloc_getCountry(localeID, rgBuf, ULOC_RG_BUFLEN, status);
        if (U_FAILURE(*status)) {
            rgLen = 0;
        } else if (rgLen == 0 && inferRegion) {
            // no unicode_region_subtag but inferRegion TRUE, try likely subtags
            char locBuf[ULOC_FULLNAME_CAPACITY];
            rgStatus = U_ZERO_ERROR;
            (void)uloc_addLikelySubtags(localeID, locBuf, ULOC_FULLNAME_CAPACITY, &rgStatus);
            if (U_SUCCESS(rgStatus)) {
                rgLen = uloc_getCountry(locBuf, rgBuf, ULOC_RG_BUFLEN, status);
                if (U_FAILURE(*status)) {
                    rgLen = 0;
                }
            }
        }
    }

    rgBuf[rgLen] = 0;
    uprv_strncpy(region, rgBuf, regionCapacity);
    return u_terminateChars(region, regionCapacity, rgLen, status);
}